

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O0

int32 store_reg_mat(char *regmatfn,uint32 *veclen,uint32 n_class,uint32 n_stream,float32 ****A,
                   float32 ***B)

{
  FILE *__stream;
  FILE *fp;
  uint32 m;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 ***B_local;
  float32 ****A_local;
  uint32 n_stream_local;
  uint32 n_class_local;
  uint32 *veclen_local;
  char *regmatfn_local;
  
  __stream = fopen(regmatfn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x37,"Unable to open %s to store MLLR matrices\n",regmatfn);
    regmatfn_local._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%d\n",(ulong)n_class);
    fprintf(__stream,"%d\n",(ulong)n_stream);
    for (fp._0_4_ = 0; (uint)fp < n_class; fp._0_4_ = (uint)fp + 1) {
      for (k = 0; k < n_stream; k = k + 1) {
        fprintf(__stream,"%d\n",(ulong)veclen[k]);
        for (m = 0; m < veclen[k]; m = m + 1) {
          fp._4_4_ = 0;
          while( true ) {
            if (veclen[k] <= fp._4_4_) break;
            fprintf(__stream,"%f ",(double)(float)A[(uint)fp][k][m][fp._4_4_]);
            fp._4_4_ = fp._4_4_ + 1;
          }
          fprintf(__stream,"\n");
        }
        m = 0;
        while( true ) {
          if (veclen[k] <= m) break;
          fprintf(__stream,"%f ",(double)(float)B[(uint)fp][k][m]);
          m = m + 1;
        }
        fprintf(__stream,"\n");
        m = 0;
        while( true ) {
          if (veclen[k] <= m) break;
          fprintf(__stream,"1.0 ");
          m = m + 1;
        }
        fprintf(__stream,"\n");
      }
    }
    fclose(__stream);
    regmatfn_local._4_4_ = 0;
  }
  return regmatfn_local._4_4_;
}

Assistant:

int32
store_reg_mat (const char    *regmatfn,
	       const uint32  *veclen,
	       uint32  n_class,
	       uint32  n_stream,
	       float32 ****A,
	       float32 ***B)
{
    uint32 i,j,k,m;
    FILE  *fp;

    if ((fp = fopen(regmatfn,"w")) == NULL) {
	E_INFO("Unable to open %s to store MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fprintf(fp,"%d\n",n_class);
    fprintf(fp,"%d\n",n_stream); 
    for (m = 0; m < n_class; m++) {
	for (i = 0; i < n_stream; i++) {
	    fprintf(fp,"%d\n", veclen[i]); 
	    for (j = 0; j < veclen[i]; j++) {
		for (k = 0; k < veclen[i]; ++k) {
		    fprintf(fp,"%f ",A[m][i][j][k]);
		}
		fprintf(fp,"\n");
	    }
	    for (j = 0; j < veclen[i]; j++) {
		fprintf(fp,"%f ",B[m][i][j]);
	    }
	    fprintf(fp,"\n");
	    /* Identity transform for variances. */
	    for (j = 0; j < veclen[i]; j++) {
		fprintf(fp,"1.0 ");
	    }
	    fprintf(fp,"\n");
	}
    }
    fclose(fp);
    return S3_SUCCESS;
}